

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CastExpression::Deserialize(CastExpression *this,Deserializer *deserializer)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  CastExpression *this_00;
  pointer pCVar6;
  pointer *__ptr;
  byte bVar7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var9;
  _Head_base<0UL,_duckdb::CastExpression_*,_false> local_48;
  LogicalType local_40;
  
  this_00 = (CastExpression *)operator_new(0x60);
  CastExpression(this_00);
  local_48._M_head_impl = this_00;
  pCVar6 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_48);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"child");
  bVar7 = (byte)iVar4;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pCVar6->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar6->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 0;
      goto LAB_01749bf4;
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var9._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&local_40,deserializer);
      _Var9._M_head_impl =
           (ParsedExpression *)
           CONCAT62(local_40._2_6_,CONCAT11(local_40.physical_type_,local_40.id_));
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pCVar6->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar6->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var9._M_head_impl;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 1;
      goto LAB_01749bf4;
    }
  }
  (*((_Var8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_01749bf4:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  pCVar6 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_48);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"cast_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_40,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (pCVar6->cast_type).id_ = local_40.id_;
  (pCVar6->cast_type).physical_type_ = local_40.physical_type_;
  peVar1 = (pCVar6->cast_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (pCVar6->cast_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pCVar6->cast_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (pCVar6->cast_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_40.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_40);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pCVar6 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_48);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"try_cast");
  if ((char)uVar5 == '\0') {
    uVar3 = false;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar3 = (undefined1)iVar4;
  }
  pCVar6->try_cast = (bool)uVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar5 & 0xff));
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_48._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CastExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CastExpression>(new CastExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "child", result->child);
	deserializer.ReadProperty<LogicalType>(201, "cast_type", result->cast_type);
	deserializer.ReadPropertyWithDefault<bool>(202, "try_cast", result->try_cast);
	return std::move(result);
}